

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void ossaddsb(osgen_txtwin_t *win,char *p,size_t len,int draw)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  int y;
  int top;
  int local_3c;
  int local_34;
  
  if (win->txtbuf == (char *)0x0) {
    return;
  }
  local_3c = (win->base).x - (win->base).scrollx;
  y = (win->base).y - (win->base).scrolly;
LAB_001eb446:
  do {
    local_34 = 0;
    while( true ) {
      while( true ) {
        while( true ) {
          if (len == 0) {
            osssb_add_safety_null(win);
            if (draw == 0) {
              return;
            }
            osgen_scrdisp(&win->base,local_3c,y,local_34);
            osgen_auto_vscroll(win);
            return;
          }
          cVar1 = *p;
          if (cVar1 != '\x01') break;
          bVar3 = p[1];
          (win->base).txtattr = (uint)bVar3;
          if ((win->base).x == 0) {
            win->solattr = (uint)bVar3;
          }
          osssb_add_bytes(win,p,2);
          p = p + 2;
          len = len - 2;
        }
        if (cVar1 != '\x02') break;
        cVar1 = p[1];
        (win->base).txtfg = cVar1;
        cVar2 = p[2];
        (win->base).txtbg = cVar2;
        if ((win->base).x == 0) {
          win->solfg = (int)cVar1;
          win->solbg = (int)cVar2;
        }
        osssb_add_bytes(win,p,3);
        p = p + 3;
        len = len - 3;
      }
      if (cVar1 == '\n') {
        osssb_new_line(win);
        if (draw != 0) {
          osgen_scrdisp(&win->base,local_3c,y,local_34);
        }
        p = p + 1;
        len = len - 1;
        local_3c = (win->base).x - (win->base).scrollx;
        y = y + 1;
        if (draw != 0) {
          osgen_auto_vscroll(win);
        }
        goto LAB_001eb446;
      }
      if (cVar1 == '\r') break;
      iVar4 = osssb_add_byte(win,cVar1);
      if (iVar4 != 0) {
        iVar4 = (win->base).x;
        if ((win->base).xmax < iVar4) {
          (win->base).xmax = iVar4;
        }
        (win->base).x = iVar4 + 1;
        local_34 = local_34 + 1;
      }
      p = p + 1;
      len = len - 1;
    }
    pcVar5 = osgen_get_line(win,(win->base).y);
    win->txtfree = pcVar5;
    iVar4 = win->solbg;
    (win->base).txtfg = (char)win->solfg;
    (win->base).txtbg = (char)iVar4;
    (win->base).txtattr = win->solattr;
    osssb_add_color_code(win);
    if ((-1 < y && draw != 0) && (y < (int)(win->base).ht)) {
      top = (win->base).winy + y;
      iVar4 = (win->base).winx;
      ossclr(top,iVar4,top,iVar4 + (int)(win->base).wid + -1,(win->base).oss_fillcolor);
    }
    (win->base).x = 0;
    p = p + 1;
    len = len - 1;
    local_3c = 0;
  } while( true );
}

Assistant:

static void ossaddsb(osgen_txtwin_t *win, const char *p, size_t len, int draw)
{
    int startx;
    int starty;
    int line_len;

    /* if there's no scrollback buffer, ignore it */
    if (win->txtbuf == 0)
        return;

    /* note the starting x,y position, for redrawing purposes */
    startx = win->base.x - win->base.scrollx;
    starty = win->base.y - win->base.scrolly;

    /* we haven't added any characters to the line yet */
    line_len = 0;

    /*
     *   Copy the text into the screen buffer, respecting the circular
     *   nature of the screen buffer.  If the given text wraps lines,
     *   enter an explicit carriage return into the text to ensure that
     *   users can correctly count lines.
     */
    while (len != 0)
    {
        /* check what we have */
        switch(*p)
        {
        case OSGEN_ATTR:
            /* switch to the new attributes */
            win->base.txtattr = (unsigned char)*(p+1);

            /* 
             *   if we're at the start of the line, this is the start-of-line
             *   attribute - this will ensure that if we back up with '\r',
             *   we'll re-apply this attribute change 
             */
            if (win->base.x == 0)
                win->solattr = win->base.txtattr;

            /* add the two-byte sequence */
            osssb_add_bytes(win, p, 2);
            p += 2;
            len -= 2;
            break;

        case OSGEN_COLOR:
            /* switch to the new colors */
            win->base.txtfg = (unsigned char)*(p+1);
            win->base.txtbg = (unsigned char)*(p+2);

            /* 
             *   if we're at the start of the line, this is the new
             *   start-of-line color 
             */
            if (win->base.x == 0)
            {
                win->solfg = win->base.txtfg;
                win->solbg = win->base.txtbg;
            }

            /* add and skip the three-byte color sequence */
            osssb_add_bytes(win, p, 3);
            p += 3;
            len -= 3;
            break;
            
        case '\n':
            /* add the new line */
            osssb_new_line(win);

            /* draw the part of the line we added */
            if (draw)
                osgen_scrdisp(&win->base, startx, starty, line_len);

            /* skip this character */
            ++p;
            --len;

            /* reset to the next line */
            startx = win->base.x - win->base.scrollx;
            ++starty;
            line_len = 0;

            /* bring the cursor onto the screen if auto-vscrolling */
            if (draw)
                osgen_auto_vscroll(win);

            /* done */
            break;

        case '\r':
            /*
             *   We have a plain carriage return, which indicates that we
             *   should go back to the start of the current line and
             *   overwrite it.  (This is most likely to occur for the
             *   "[More]" prompt.)
             */

            /* set the free pointer back to the start of the current line */
            win->txtfree = osgen_get_line(win, win->base.y);

            /* switch back to the color as of the start of the line */
            win->base.txtfg = win->solfg;
            win->base.txtbg = win->solbg;
            win->base.txtattr = win->solattr;

            /* 
             *   since we're back at the start of the line, add a color code
             *   if necessary 
             */
            osssb_add_color_code(win);

            /* clear the window area of the line we're overwriting */
            if (draw && starty >= 0 && starty < (int)win->base.ht)
                ossclr(win->base.winy + starty, win->base.winx,
                       win->base.winy + starty,
                       win->base.winx + win->base.wid - 1,
                       win->base.oss_fillcolor);

            /* reset to the start of the line */
            line_len = 0;
            startx = 0;

            /* move to the left column */
            win->base.x = 0;

            /* skip this character */
            ++p;
            --len;

            /* done */
            break;

        default:
            /* for anything else, simply store the byte in the buffer */
            if (osssb_add_byte(win, *p))
            {
                /* note the maximum output position if appropriate */
                if (win->base.x > win->base.xmax)
                    win->base.xmax = win->base.x;

                /* adjust the output x position */
                win->base.x++;

                /* count the ordinary character in the display length */
                ++line_len;
            }
            
            /* skip the character */
            ++p;
            --len;
                
            /* done */
            break;
        }
    }

    /* 
     *   Add a safety null terminator after each addition, in case we need
     *   to look at the buffer before this line is finished.  
     */
    osssb_add_safety_null(win);

    /* display the added text */
    if (draw)
    {
        /* show the added text */
        osgen_scrdisp(&win->base, startx, starty, line_len);

        /* bring the cursor onto the screen if auto-vscrolling */
        osgen_auto_vscroll(win);
    }
}